

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_value_function.cpp
# Opt level: O2

void __thiscall
duckdb::WindowValueLocalState::Sink
          (WindowValueLocalState *this,WindowExecutorGlobalState *gstate,DataChunk *sink_chunk,
          DataChunk *coll_chunk,idx_t input_idx)

{
  SelectionVector *count;
  sel_t *psVar1;
  reference this_00;
  WindowMergeSortTreeLocalState *this_01;
  idx_t filtered;
  SelectionVector *pSVar2;
  sel_t sVar3;
  optional_ptr<duckdb::SelectionVector,_true> filter_sel;
  UnifiedVectorFormat child_data;
  UnifiedVectorFormat local_78;
  
  if ((this->local_value).
      super_unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowAggregatorState_*,_std::default_delete<duckdb::WindowAggregatorState>_>
      .super__Head_base<0UL,_duckdb::WindowAggregatorState_*,_false>._M_head_impl !=
      (WindowAggregatorState *)0x0) {
    count = (SelectionVector *)coll_chunk->count;
    this_00 = vector<duckdb::Vector,_true>::get<true>(&coll_chunk->data,this->gvstate->child_idx);
    UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
    Vector::ToUnifiedFormat(this_00,(idx_t)count,&local_78);
    filtered = 0;
    filter_sel.ptr = (SelectionVector *)0x0;
    if (gstate->executor->wexpr->ignore_nulls == true) {
      pSVar2 = (SelectionVector *)0x0;
      if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        filtered = 0;
        filter_sel.ptr = pSVar2;
      }
      else {
        psVar1 = (this->sort_nulls).sel_vector;
        filter_sel.ptr = &this->sort_nulls;
        filtered = 0;
        while (sVar3 = (sel_t)pSVar2, pSVar2 < count) {
          if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
            pSVar2 = (SelectionVector *)(ulong)(local_78.sel)->sel_vector[(long)pSVar2];
          }
          if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask
               [(ulong)pSVar2 >> 6] >> ((ulong)pSVar2 & 0x3f) & 1) != 0) {
            psVar1[filtered] = sVar3;
            filtered = filtered + 1;
          }
          pSVar2 = (SelectionVector *)(ulong)(sVar3 + 1);
        }
      }
    }
    this_01 = (WindowMergeSortTreeLocalState *)
              unique_ptr<duckdb::WindowAggregatorState,_std::default_delete<duckdb::WindowAggregatorState>,_true>
              ::operator->(&this->local_value);
    WindowMergeSortTreeLocalState::SinkChunk(this_01,sink_chunk,input_idx,filter_sel,filtered);
    UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  }
  return;
}

Assistant:

WindowFirstValueExecutor::WindowFirstValueExecutor(BoundWindowExpression &wexpr, ClientContext &context,
                                                   WindowSharedExpressions &shared)
    : WindowValueExecutor(wexpr, context, shared) {
}